

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

Vec_Wrd_t * Gia_ManSimRel(Gia_Man_t *p,Vec_Int_t *vObjs,Vec_Wrd_t *vVals)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  Vec_Int_t *pVVar4;
  int iVar5;
  int iVar6;
  Vec_Wrd_t *vSims_00;
  word *pwVar7;
  ulong uVar8;
  bool bVar9;
  Vec_Wrd_t *vSims;
  Vec_Wrd_t *vRel;
  Gia_Obj_t *pObj;
  int local_30;
  int iObj;
  int m;
  int i;
  int nMints;
  int nWords;
  Vec_Wrd_t *vVals_local;
  Vec_Int_t *vObjs_local;
  Gia_Man_t *p_local;
  
  _nMints = vVals;
  vVals_local = (Vec_Wrd_t *)vObjs;
  vObjs_local = (Vec_Int_t *)p;
  iVar5 = Vec_WrdSize(p->vSimsPi);
  iVar6 = Gia_ManCiNum((Gia_Man_t *)vObjs_local);
  i = iVar5 / iVar6;
  iVar5 = Vec_IntSize((Vec_Int_t *)vVals_local);
  m = 1 << ((byte)iVar5 & 0x1f);
  vSims = Vec_WrdStart(i * m);
  iVar5 = Gia_ManObjNum((Gia_Man_t *)vObjs_local);
  vSims_00 = Vec_WrdStart(iVar5 * i * m);
  Gia_ManSimRelAssignInputs
            ((Gia_Man_t *)vObjs_local,i * m,vSims_00,i,*(Vec_Wrd_t **)(vObjs_local + 0x34));
  for (iObj = 0; iVar5 = iObj, iVar6 = Vec_IntSize((Vec_Int_t *)vVals_local), iVar5 < iVar6;
      iObj = iObj + 1) {
    pObj._4_4_ = Vec_IntEntry((Vec_Int_t *)vVals_local,iObj);
    for (local_30 = 0; local_30 < m; local_30 = local_30 + 1) {
      if ((local_30 >> ((byte)iObj & 0x1f) & 1U) == 0) {
        pwVar7 = Vec_WrdEntryP(vSims_00,pObj._4_4_ * m * i + i * local_30);
        memset(pwVar7,0,(long)i << 3);
      }
      else {
        pwVar7 = Vec_WrdEntryP(vSims_00,pObj._4_4_ * m * i + i * local_30);
        memset(pwVar7,0xff,(long)i << 3);
      }
    }
  }
  Gia_ManCleanPhase((Gia_Man_t *)vObjs_local);
  iObj = 0;
  while( true ) {
    iVar5 = iObj;
    iVar6 = Vec_IntSize((Vec_Int_t *)vVals_local);
    pVVar4 = vObjs_local;
    bVar9 = false;
    if (iVar5 < iVar6) {
      iVar5 = Vec_IntEntry((Vec_Int_t *)vVals_local,iObj);
      vRel = (Vec_Wrd_t *)Gia_ManObj((Gia_Man_t *)pVVar4,iVar5);
      bVar9 = vRel != (Vec_Wrd_t *)0x0;
    }
    if (!bVar9) break;
    uVar1._0_4_ = vRel->nCap;
    uVar1._4_4_ = vRel->nSize;
    uVar8 = uVar1 & 0x7fffffffffffffff | 0x8000000000000000;
    vRel->nCap = (int)uVar8;
    vRel->nSize = (int)(uVar8 >> 0x20);
    iObj = iObj + 1;
  }
  iObj = 0;
  while( true ) {
    bVar9 = false;
    if (iObj < *(int *)&vObjs_local[1].pArray) {
      vRel = (Vec_Wrd_t *)Gia_ManObj((Gia_Man_t *)vObjs_local,iObj);
      bVar9 = vRel != (Vec_Wrd_t *)0x0;
    }
    if (!bVar9) break;
    iVar5 = Gia_ObjIsAnd((Gia_Obj_t *)vRel);
    if ((iVar5 != 0) && (lVar2._0_4_ = vRel->nCap, lVar2._4_4_ = vRel->nSize, -1 < lVar2)) {
      Gia_ManSimPatSimAnd((Gia_Man_t *)vObjs_local,iObj,(Gia_Obj_t *)vRel,i * m,vSims_00);
    }
    iObj = iObj + 1;
  }
  iObj = 0;
  while( true ) {
    iVar5 = iObj;
    iVar6 = Vec_IntSize((Vec_Int_t *)vObjs_local[4].pArray);
    bVar9 = false;
    if (iVar5 < iVar6) {
      vRel = (Vec_Wrd_t *)Gia_ManCo((Gia_Man_t *)vObjs_local,iObj);
      bVar9 = vRel != (Vec_Wrd_t *)0x0;
    }
    pVVar4 = vObjs_local;
    if (!bVar9) break;
    lVar3._0_4_ = vRel->nCap;
    lVar3._4_4_ = vRel->nSize;
    if (-1 < lVar3) {
      iVar5 = Gia_ObjId((Gia_Man_t *)vObjs_local,(Gia_Obj_t *)vRel);
      Gia_ManSimPatSimPo((Gia_Man_t *)pVVar4,iVar5,(Gia_Obj_t *)vRel,i * m,vSims_00);
    }
    iObj = iObj + 1;
  }
  iObj = 0;
  while( true ) {
    iVar5 = iObj;
    iVar6 = Vec_IntSize((Vec_Int_t *)vVals_local);
    pVVar4 = vObjs_local;
    bVar9 = false;
    if (iVar5 < iVar6) {
      iVar5 = Vec_IntEntry((Vec_Int_t *)vVals_local,iObj);
      vRel = (Vec_Wrd_t *)Gia_ManObj((Gia_Man_t *)pVVar4,iVar5);
      bVar9 = vRel != (Vec_Wrd_t *)0x0;
    }
    if (!bVar9) break;
    uVar8._0_4_ = vRel->nCap;
    uVar8._4_4_ = vRel->nSize;
    vRel->nCap = (int)(uVar8 & 0x7fffffffffffffff);
    vRel->nSize = (int)((uVar8 & 0x7fffffffffffffff) >> 0x20);
    iObj = iObj + 1;
  }
  iVar5 = Gia_ManSimRelCollectOutputs((Gia_Man_t *)vObjs_local,i * m,vSims_00,i,_nMints,vSims);
  if (iVar5 != 0) {
    Vec_WrdFreeP(&vSims);
  }
  Vec_WrdFree(vSims_00);
  return vSims;
}

Assistant:

Vec_Wrd_t * Gia_ManSimRel( Gia_Man_t * p, Vec_Int_t * vObjs, Vec_Wrd_t * vVals )
{
    int nWords = Vec_WrdSize(p->vSimsPi) / Gia_ManCiNum(p);
    int nMints = 1 << Vec_IntSize(vObjs), i, m, iObj;
    Gia_Obj_t * pObj;
    Vec_Wrd_t * vRel  = Vec_WrdStart( nWords * nMints );
    Vec_Wrd_t * vSims = Vec_WrdStart( Gia_ManObjNum(p) * nWords * nMints );
    Gia_ManSimRelAssignInputs( p, nWords * nMints, vSims, nWords, p->vSimsPi );
    Vec_IntForEachEntry( vObjs, iObj, i )
        for ( m = 0; m < nMints; m++ )
            if ( (m >> i) & 1 )
                memset( Vec_WrdEntryP(vSims, iObj*nMints*nWords + nWords*m), 0xFF, sizeof(word)*nWords );    
            else
                memset( Vec_WrdEntryP(vSims, iObj*nMints*nWords + nWords*m), 0x00, sizeof(word)*nWords );    
    Gia_ManCleanPhase( p );
    Gia_ManForEachObjVec( vObjs, p, pObj, i )
        pObj->fPhase = 1;
    Gia_ManForEachAnd( p, pObj, i ) 
        if ( !pObj->fPhase )
            Gia_ManSimPatSimAnd( p, i, pObj, nWords * nMints, vSims );
    Gia_ManForEachCo( p, pObj, i )
        if ( !pObj->fPhase )
            Gia_ManSimPatSimPo( p, Gia_ObjId(p, pObj), pObj, nWords * nMints, vSims );
    Gia_ManForEachObjVec( vObjs, p, pObj, i )
        pObj->fPhase = 0;
    if ( Gia_ManSimRelCollectOutputs( p, nWords * nMints, vSims, nWords, vVals, vRel ) )
        Vec_WrdFreeP( &vRel );
    Vec_WrdFree( vSims );
    return vRel;
}